

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MQTTClient.cpp
# Opt level: O3

bool __thiscall
Network::Client::RingBufferStorage::Impl::load
          (Impl *this,uint16 packetID,uint8 **packetHead,uint32 *sizeHead,uint8 **packetTail,
          uint32 *sizeTail)

{
  byte bVar1;
  PacketBookmark *pPVar2;
  long lVar3;
  byte bVar4;
  uint uVar5;
  
  bVar1 = this->packetsCount;
  if (bVar1 == 0) {
    return false;
  }
  bVar4 = 0;
  lVar3 = 0;
  do {
    if (*(uint16 *)(this->packets + lVar3) == packetID) {
      if (bVar1 <= bVar4) {
        return false;
      }
      *packetHead = this->buffer + *(uint *)(this->packets + lVar3 + 8);
      pPVar2 = this->packets;
      uVar5 = (this->sm1 - *(int *)(pPVar2 + lVar3 + 8)) + 1;
      if (*(uint *)(pPVar2 + lVar3 + 4) < uVar5) {
        uVar5 = *(uint *)(pPVar2 + lVar3 + 4);
      }
      *sizeHead = uVar5;
      *sizeTail = *(int *)(pPVar2 + lVar3 + 4) - uVar5;
      *packetTail = this->buffer;
      return true;
    }
    lVar3 = lVar3 + 0xc;
    bVar4 = bVar4 + 1;
  } while ((ulong)((uint)bVar1 * 4) * 3 != lVar3);
  return false;
}

Assistant:

bool load(const uint16 packetID, const uint8 *& packetHead, uint32 & sizeHead, const uint8 *& packetTail,  uint32 & sizeTail)
        {
            // Look for the packet
            uint8 i = findID(packetID);
            if (i == packetsCount) return false;

            // Check if the packet is split
            packetHead = buffer + packets[i].pos;
            sizeHead = min(packets[i].size, (sm1 - packets[i].pos + 1));
            sizeTail = packets[i].size - sizeHead;
            packetTail = buffer;
            return true;
        }